

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

int Gia_ManChoiceMiter_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  uint uVar2;
  
  uVar2 = pObj->Value;
  if (uVar2 == 0xffffffff) {
    Gia_ManChoiceMiter_rec(pNew,p,pObj + -(*(ulong *)pObj & 0x1fffffff));
    uVar1 = *(ulong *)pObj;
    if ((uVar1 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar1) {
      Gia_ManChoiceMiter_rec(pNew,p,pObj + -(uVar1 >> 0x20 & 0x1fffffff));
      uVar1 = *(ulong *)pObj;
      if (((int)pObj[-(uVar1 & 0x1fffffff)].Value < 0) ||
         (uVar2 = (uint)(uVar1 >> 0x20), (int)pObj[-(ulong)(uVar2 & 0x1fffffff)].Value < 0)) {
LAB_001ec94b:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar2 = Gia_ManHashAnd(pNew,(uint)(uVar1 >> 0x1d) & 1 ^ pObj[-(uVar1 & 0x1fffffff)].Value,
                             pObj[-(ulong)(uVar2 & 0x1fffffff)].Value ^ uVar2 >> 0x1d & 1);
    }
    else {
      if ((int)pObj[-(uVar1 & 0x1fffffff)].Value < 0) goto LAB_001ec94b;
      uVar2 = Gia_ManAppendCo(pNew,pObj[-(uVar1 & 0x1fffffff)].Value ^ (uint)(uVar1 >> 0x1d) & 1);
    }
    pObj->Value = uVar2;
  }
  return uVar2;
}

Assistant:

int Gia_ManChoiceMiter_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( ~pObj->Value )
        return pObj->Value;
    Gia_ManChoiceMiter_rec( pNew, p, Gia_ObjFanin0(pObj) );
    if ( Gia_ObjIsCo(pObj) )
        return pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManChoiceMiter_rec( pNew, p, Gia_ObjFanin1(pObj) );
    return pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}